

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O3

void __thiscall
PersistentStorageJsonTestSuite_DelNetwork_Test::~PersistentStorageJsonTestSuite_DelNetwork_Test
          (PersistentStorageJsonTestSuite_DelNetwork_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, DelNetwork)
{
    PersistentStorageJson psj("");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    NetworkId newId;
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk1", 0xFFFFFFFFFFFFFFF1ll, 11, 0xFFF1, "2000:aaa1::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);

    EXPECT_TRUE(psj.Del(NetworkId(0)) == PersistentStorage::Status::kSuccess);
    // Absent network successfully deletes newertheless
    EXPECT_TRUE(psj.Del(NetworkId(1)) == PersistentStorage::Status::kSuccess);

    NetworkArray nets;
    EXPECT_TRUE(psj.Lookup(Network{}, nets) == PersistentStorage::Status::kNotFound);

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}